

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  bool bVar1;
  char *pcVar2;
  string ruleVar;
  string local_58;
  string local_38;
  
  pcVar2 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_58);
  bVar1 = cmGeneratorTarget::HasImplibGNUtoMS((this->super_cmCommonTargetGenerator).GeneratorTarget)
  ;
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_","");
    cmGeneratorTarget::GetLinkerLanguage
              (&local_38,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &(this->super_cmCommonTargetGenerator).ConfigName);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_58);
    pcVar2 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_58);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS()) {
    std::string ruleVar = "CMAKE_";
    ruleVar += this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    ruleVar += "_GNUtoMS_RULE";
    if (const char* rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += rule;
    }
  }
  return linkRule;
}